

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O1

int __thiscall DIntermissionScreenCast::Responder(DIntermissionScreenCast *this,event_t *ev)

{
  AActor *actor;
  uint uVar1;
  FState *pFVar2;
  PClassActor *pPVar3;
  int iVar4;
  FSoundID *sound_id;
  FName label [2];
  FSoundID local_34;
  FSoundID local_30;
  FSoundID local_2c;
  undefined8 local_28;
  
  if (ev->type != '\x01') {
    return 0;
  }
  if (this->castdeath != false) {
    return 1;
  }
  this->castdeath = true;
  if (this->mClass == (PClassActor *)0x0) {
    return 1;
  }
  local_28 = 0xd00000008c;
  pFVar2 = PClassActor::FindState(this->mClass,2,(FName *)&local_28,false);
  this->caststate = pFVar2;
  if (pFVar2 == (FState *)0x0) {
    return -1;
  }
  iVar4 = (int)pFVar2->Tics;
  if (pFVar2->TicRange != 0) {
    uVar1 = FRandom::GenRand32(&FState::pr_statetics);
    iVar4 = iVar4 + uVar1 % (pFVar2->TicRange + 1);
  }
  this->casttics = iVar4;
  this->castframes = 0;
  this->castattacking = false;
  pPVar3 = this->mClass;
  if (pPVar3 == (PClassActor *)APlayerPawn::RegistrationInfo.MyClass) {
LAB_0030131c:
    actor = (AActor *)(&players)[(long)consoleplayer * 0x54];
    local_2c.ID = S_FindSound("*death");
    iVar4 = S_FindSkinnedSound(actor,&local_2c);
    if (iVar4 == 0) goto LAB_00301388;
    sound_id = &local_30;
  }
  else {
    do {
      pPVar3 = (PClassActor *)(pPVar3->super_PClass).ParentClass;
      if (pPVar3 == (PClassActor *)APlayerPawn::RegistrationInfo.MyClass) break;
    } while (pPVar3 != (PClassActor *)0x0);
    if (pPVar3 != (PClassActor *)0x0) goto LAB_0030131c;
    iVar4 = (this->mDefaults->DeathSound).super_FSoundID.ID;
    if (iVar4 == 0) goto LAB_00301388;
    sound_id = &local_34;
  }
  sound_id->ID = iVar4;
  S_Sound(0x22,sound_id,1.0,0.0);
LAB_00301388:
  if (pFVar2 == (FState *)0x0) {
    return -1;
  }
  return 1;
}

Assistant:

int DIntermissionScreenCast::Responder (event_t *ev)
{
	if (ev->type != EV_KeyDown) return 0;

	if (castdeath)
		return 1;					// already in dying frames

	castdeath = true;

	if (mClass != NULL)
	{
		FName label[] = {NAME_Death, NAME_Cast};
		caststate = mClass->FindState(2, label);
		if (caststate == NULL) return -1;

		casttics = caststate->GetTics();
		castframes = 0;
		castattacking = false;

		if (mClass->IsDescendantOf(RUNTIME_CLASS(APlayerPawn)))
		{
			int snd = S_FindSkinnedSound(players[consoleplayer].mo, "*death");
			if (snd != 0) S_Sound (CHAN_VOICE | CHAN_UI, snd, 1, ATTN_NONE);
		}
		else if (mDefaults->DeathSound)
		{
			S_Sound (CHAN_VOICE | CHAN_UI, mDefaults->DeathSound, 1, ATTN_NONE);
		}
	}
	return true;
}